

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall
soul::StructuralParser::parseEndpoint
          (StructuralParser *this,ProcessorBase *p,bool isInput,EndpointType endpointType)

{
  Allocator *pAVar1;
  bool bVar2;
  EndpointDeclaration *e;
  EndpointDetails *pEVar3;
  EndpointDeclaration *e_00;
  EndpointDetails *pEVar4;
  bool local_5d;
  EndpointType local_5c;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> local_58;
  
  pAVar1 = this->allocator;
  local_5d = isInput;
  local_5c = endpointType;
  getContext((Context *)&local_58,this);
  e = allocate<soul::AST::EndpointDeclaration,soul::AST::Allocator&,soul::AST::Context,bool&,soul::EndpointType&>
                (this,pAVar1,(Context *)&local_58,&local_5d,&local_5c);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_58);
  parseEndpointTypeList(&local_58,this,local_5c);
  pEVar3 = pool_ptr<soul::AST::EndpointDetails>::operator*(&e->details);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::operator=
            (&pEVar3->dataTypes,&local_58);
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::clear(&local_58);
  parseInputOrOutputName(this,e);
  local_58.items = (pool_ref<soul::AST::Expression> *)e;
  while( true ) {
    std::
    vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::AST::EndpointDeclaration>>
              ((vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
                *)&p->endpoints,(pool_ref<soul::AST::EndpointDeclaration> *)&local_58);
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275d9e);
    if (!bVar2) break;
    pAVar1 = this->allocator;
    getContext((Context *)&local_58,this);
    e_00 = allocate<soul::AST::EndpointDeclaration,soul::AST::Allocator&,soul::AST::Context,bool&,soul::EndpointType&>
                     (this,pAVar1,(Context *)&local_58,&local_5d,&local_5c);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&local_58);
    pEVar3 = pool_ptr<soul::AST::EndpointDetails>::operator*(&e->details);
    pEVar4 = pool_ptr<soul::AST::EndpointDetails>::operator*(&e_00->details);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::operator=
              (&pEVar4->dataTypes,&pEVar3->dataTypes);
    parseInputOrOutputName(this,e_00);
    local_58.items = (pool_ref<soul::AST::Expression> *)e_00;
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2743e3);
  return;
}

Assistant:

void parseEndpoint (AST::ProcessorBase& p, bool isInput, EndpointType endpointType)
    {
        auto& first = allocate<AST::EndpointDeclaration> (allocator, getContext(), isInput, endpointType);
        first.getDetails().dataTypes = parseEndpointTypeList (endpointType);
        parseInputOrOutputName (first);
        p.endpoints.push_back (first);

        while (matchIf (Operator::comma))
        {
            auto& e = allocate<AST::EndpointDeclaration> (allocator, getContext(), isInput, endpointType);
            e.getDetails().dataTypes = first.getDetails().dataTypes;
            parseInputOrOutputName (e);
            p.endpoints.push_back (e);
        }

        expect (Operator::semicolon);
    }